

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O1

void __thiscall
icu_63::CollationLoader::CollationLoader
          (CollationLoader *this,CollationCacheEntry *re,Locale *requested,UErrorCode *errorCode)

{
  Locale *this_00;
  int iVar1;
  int32_t iVar2;
  UnifiedCache *pUVar3;
  char *pcVar4;
  Locale local_110;
  
  pUVar3 = UnifiedCache::getInstance(errorCode);
  this->cache = pUVar3;
  this->rootEntry = re;
  Locale::Locale(&this->validLocale,&re->validLocale);
  this_00 = &this->locale;
  Locale::Locale(this_00,requested);
  this->typesTried = 0;
  this->typeFallback = '\0';
  this->type[0] = '\0';
  this->defaultType[0] = '\0';
  this->bundle = (UResourceBundle *)0x0;
  this->collations = (UResourceBundle *)0x0;
  this->data = (UResourceBundle *)0x0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar4 = Locale::getBaseName(this_00);
    iVar1 = strcmp((this->locale).fullName,pcVar4);
    if (iVar1 != 0) {
      Locale::Locale(&local_110,pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar4 = this->type;
      Locale::operator=(this_00,&local_110);
      Locale::~Locale(&local_110);
      iVar2 = Locale::getKeywordValue(requested,"collation",pcVar4,0xf,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        pcVar4[iVar2] = '\0';
        if (iVar2 != 0) {
          iVar1 = uprv_stricmp_63(pcVar4,"default");
          if (iVar1 == 0) {
            *pcVar4 = '\0';
          }
          else {
            T_CString_toLowerCase_63(pcVar4);
            Locale::setKeywordValue(this_00,"collation",pcVar4,errorCode);
          }
        }
      }
      else {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
  }
  return;
}

Assistant:

CollationLoader::CollationLoader(const CollationCacheEntry *re, const Locale &requested,
                                 UErrorCode &errorCode)
        : cache(UnifiedCache::getInstance(errorCode)), rootEntry(re),
          validLocale(re->validLocale), locale(requested),
          typesTried(0), typeFallback(FALSE),
          bundle(NULL), collations(NULL), data(NULL) {
    type[0] = 0;
    defaultType[0] = 0;
    if(U_FAILURE(errorCode)) { return; }

    // Canonicalize the locale ID: Ignore all irrelevant keywords.
    const char *baseName = locale.getBaseName();
    if(uprv_strcmp(locale.getName(), baseName) != 0) {
        locale = Locale(baseName);

        // Fetch the collation type from the locale ID.
        int32_t typeLength = requested.getKeywordValue("collation",
                type, UPRV_LENGTHOF(type) - 1, errorCode);
        if(U_FAILURE(errorCode)) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        type[typeLength] = 0;  // in case of U_NOT_TERMINATED_WARNING
        if(typeLength == 0) {
            // No collation type.
        } else if(uprv_stricmp(type, "default") == 0) {
            // Ignore "default" (case-insensitive).
            type[0] = 0;
        } else {
            // Copy the collation type.
            T_CString_toLowerCase(type);
            locale.setKeywordValue("collation", type, errorCode);
        }
    }
}